

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  anon_class_16_2_0b9647cc fun;
  pointer pEVar1;
  reference count;
  long lVar2;
  Vector *in_RDX;
  int64_t extraout_RDX;
  DataChunk *in_RDI;
  hugeint_t in;
  hugeint_t addition;
  hugeint_t power_of_ten;
  uint8_t source_scale;
  RoundPrecisionFunctionData *info;
  BoundFunctionExpression *func_expr;
  undefined7 in_stack_ffffffffffffff68;
  FunctionErrors in_stack_ffffffffffffff6f;
  FunctionData *in_stack_ffffffffffffff70;
  hugeint_t *in_stack_ffffffffffffff90;
  Vector local_60 [16];
  BaseExpression *in_stack_ffffffffffffffb0;
  hugeint_t local_40;
  byte local_29;
  RoundPrecisionFunctionData *local_28;
  BoundFunctionExpression *local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_ffffffffffffffb0);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_ffffffffffffff70);
  local_28 = FunctionData::Cast<duckdb::RoundPrecisionFunctionData>(in_stack_ffffffffffffff70);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_ffffffffffffff70,
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffff70);
  local_29 = duckdb::DecimalType::GetScale((LogicalType *)(pEVar1 + 0x38));
  lVar2 = (long)(int)((uint)local_29 - local_28->target_scale);
  in.upper = extraout_RDX;
  in.lower = *(uint64_t *)(duckdb::Value::DoubleIsFinite + lVar2 * 0x10);
  local_40 = UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>
                       ((duckdb *)(&Hugeint::POWERS_OF_TEN)[lVar2 * 2],in);
  duckdb::hugeint_t::hugeint_t((hugeint_t *)&stack0xffffffffffffff90,2);
  local_60 = (Vector  [16])
             duckdb::hugeint_t::operator/(&local_40,(hugeint_t *)&stack0xffffffffffffff90);
  count = vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff70,
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  DataChunk::size(local_8);
  fun.power_of_ten = in_stack_ffffffffffffff90;
  fun.addition = &local_40;
  UnaryExecutor::
  Execute<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_>
            (local_60,local_18,(idx_t)count,fun,in_stack_ffffffffffffff6f);
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}